

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::
SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
::reserve(SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
          *this,size_t count)

{
  unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *puVar1;
  _Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_> _Var2;
  ulong uVar3;
  AlignedBuffer<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  *pAVar4;
  ulong uVar5;
  
  if (count >> 0x3d == 0) {
    uVar3 = this->buffer_capacity;
    if (uVar3 < count) {
      uVar5 = 8;
      if (8 < uVar3) {
        uVar5 = uVar3;
      }
      do {
        uVar3 = uVar5;
        uVar5 = uVar3 * 2;
      } while (uVar3 < count);
      if (uVar3 < 9) {
        pAVar4 = &this->stack_storage;
      }
      else {
        pAVar4 = (AlignedBuffer<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
                  *)malloc(uVar3 * 8);
      }
      if (pAVar4 == (AlignedBuffer<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
                     *)0x0) goto LAB_001cfbd6;
      if ((pAVar4 != (AlignedBuffer<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
                      *)(this->
                        super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
                        ).ptr) &&
         ((this->
          super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
          ).buffer_size != 0)) {
        uVar5 = 0;
        do {
          puVar1 = (this->
                   super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
                   ).ptr;
          *(ScratchMemoryAllocation **)(pAVar4->aligned_char + uVar5 * 8) =
               (ScratchMemoryAllocation *)
               puVar1[uVar5]._M_t.
               super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
               ._M_t.
               super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
               .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>;
          puVar1[uVar5]._M_t.
          super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
          ._M_t.
          super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
          .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
               (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)0x0;
          puVar1 = (this->
                   super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
                   ).ptr;
          _Var2.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
               puVar1[uVar5]._M_t.
               super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
               ._M_t.
               super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
               .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>;
          if (_Var2.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl !=
              (ScratchMemoryAllocation *)0x0) {
            (**(code **)(*(long *)_Var2.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                                  _M_head_impl + 8))();
          }
          puVar1[uVar5]._M_t.
          super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
          ._M_t.
          super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
          .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
               (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)0x0;
          uVar5 = uVar5 + 1;
        } while (uVar5 < (this->
                         super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
                         ).buffer_size);
      }
      puVar1 = (this->
               super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
               ).ptr;
      if ((AlignedBuffer<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
           *)puVar1 != &this->stack_storage) {
        free(puVar1);
      }
      (this->
      super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
      ).ptr = (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              pAVar4;
      this->buffer_capacity = uVar3;
    }
    return;
  }
LAB_001cfbd6:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}